

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_ftoa_rev.cc
# Opt level: O0

void require_ftoa_rev_bin(char *expected,npf_double_bin_t bin)

{
  allocator<char> local_41;
  string local_40;
  double local_20;
  double dbl;
  npf_double_bin_t bin_local;
  char *expected_local;
  
  local_20 = (double)bin;
  dbl = (double)bin;
  bin_local = (npf_double_bin_t)expected;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,expected,&local_41);
  require_ftoa_rev(&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

static void require_ftoa_rev_bin(char const *expected, npf_double_bin_t bin) {
  double dbl;
  memcpy(&dbl, &bin, sizeof(dbl));
  require_ftoa_rev(expected, dbl);
}